

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bbox.cpp
# Opt level: O1

BBox<3> * Omega_h::get_bounding_box<3>(BBox<3> *__return_storage_ptr__,Mesh *mesh)

{
  int *piVar1;
  long lVar2;
  double dVar3;
  Comm *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  Alloc *local_30 [2];
  
  Mesh::coords((Mesh *)local_30);
  find_bounding_box<3>(__return_storage_ptr__,(Reals *)local_30);
  if (((ulong)local_30[0] & 7) == 0 && local_30[0] != (Alloc *)0x0) {
    piVar1 = &local_30[0]->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_30[0]);
      operator_delete(local_30[0],0x48);
    }
  }
  lVar2 = -3;
  do {
    Mesh::comm(mesh);
    dVar3 = Comm::allreduce<double>
                      (local_40,(__return_storage_ptr__->max).super_Few<double,_3>.array_[lVar2],
                       OMEGA_H_MIN);
    (__return_storage_ptr__->max).super_Few<double,_3>.array_[lVar2] = dVar3;
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    Mesh::comm(mesh);
    dVar3 = Comm::allreduce<double>
                      (local_40,__return_storage_ptr__[1].min.super_Few<double,_3>.array_[lVar2],
                       OMEGA_H_MAX);
    __return_storage_ptr__[1].min.super_Few<double,_3>.array_[lVar2] = dVar3;
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  return __return_storage_ptr__;
}

Assistant:

BBox<dim> get_bounding_box(Mesh* mesh) {
  auto bb = find_bounding_box<dim>(mesh->coords());
  for (Int i = 0; i < dim; ++i) {
    bb.min[i] = mesh->comm()->allreduce(bb.min[i], OMEGA_H_MIN);
    bb.max[i] = mesh->comm()->allreduce(bb.max[i], OMEGA_H_MAX);
  }
  return bb;
}